

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000198110 = 0x2e2e2e2e2e2e2e;
    uRam0000000000198117._0_1_ = '.';
    uRam0000000000198117._1_1_ = '.';
    uRam0000000000198117._2_1_ = '.';
    uRam0000000000198117._3_1_ = '.';
    uRam0000000000198117._4_1_ = '.';
    uRam0000000000198117._5_1_ = '.';
    uRam0000000000198117._6_1_ = '.';
    uRam0000000000198117._7_1_ = '.';
    DAT_00198100 = '.';
    DAT_00198100_1._0_1_ = '.';
    DAT_00198100_1._1_1_ = '.';
    DAT_00198100_1._2_1_ = '.';
    DAT_00198100_1._3_1_ = '.';
    DAT_00198100_1._4_1_ = '.';
    DAT_00198100_1._5_1_ = '.';
    DAT_00198100_1._6_1_ = '.';
    uRam0000000000198108 = 0x2e2e2e2e2e2e2e;
    DAT_0019810f = 0x2e;
    DAT_001980f0 = '.';
    DAT_001980f0_1._0_1_ = '.';
    DAT_001980f0_1._1_1_ = '.';
    DAT_001980f0_1._2_1_ = '.';
    DAT_001980f0_1._3_1_ = '.';
    DAT_001980f0_1._4_1_ = '.';
    DAT_001980f0_1._5_1_ = '.';
    DAT_001980f0_1._6_1_ = '.';
    uRam00000000001980f8._0_1_ = '.';
    uRam00000000001980f8._1_1_ = '.';
    uRam00000000001980f8._2_1_ = '.';
    uRam00000000001980f8._3_1_ = '.';
    uRam00000000001980f8._4_1_ = '.';
    uRam00000000001980f8._5_1_ = '.';
    uRam00000000001980f8._6_1_ = '.';
    uRam00000000001980f8._7_1_ = '.';
    DAT_001980e0 = '.';
    DAT_001980e0_1._0_1_ = '.';
    DAT_001980e0_1._1_1_ = '.';
    DAT_001980e0_1._2_1_ = '.';
    DAT_001980e0_1._3_1_ = '.';
    DAT_001980e0_1._4_1_ = '.';
    DAT_001980e0_1._5_1_ = '.';
    DAT_001980e0_1._6_1_ = '.';
    uRam00000000001980e8._0_1_ = '.';
    uRam00000000001980e8._1_1_ = '.';
    uRam00000000001980e8._2_1_ = '.';
    uRam00000000001980e8._3_1_ = '.';
    uRam00000000001980e8._4_1_ = '.';
    uRam00000000001980e8._5_1_ = '.';
    uRam00000000001980e8._6_1_ = '.';
    uRam00000000001980e8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001980d8._0_1_ = '.';
    uRam00000000001980d8._1_1_ = '.';
    uRam00000000001980d8._2_1_ = '.';
    uRam00000000001980d8._3_1_ = '.';
    uRam00000000001980d8._4_1_ = '.';
    uRam00000000001980d8._5_1_ = '.';
    uRam00000000001980d8._6_1_ = '.';
    uRam00000000001980d8._7_1_ = '.';
    DAT_0019811f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}